

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_168::EarlyCastFinder::flushRefCastResult
          (EarlyCastFinder *this,size_t index,Module *module)

{
  mapped_type pRVar1;
  RefCast *pRVar2;
  RefCast *pRVar3;
  Expression **ppEVar4;
  mapped_type *ppRVar5;
  pointer pRVar6;
  RefCast *local_40;
  EarlyCastFinder *local_38;
  
  pRVar6 = (this->currRefCastMove).
           super__Vector_base<wasm::(anonymous_namespace)::RefCastInfo,_std::allocator<wasm::(anonymous_namespace)::RefCastInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar6[index].target != (LocalGet *)0x0) {
    pRVar6 = pRVar6 + index;
    if (pRVar6->bestCast != (RefCast *)0x0) {
      pRVar2 = pRVar6->bestCast;
      local_38 = this;
      do {
        pRVar3 = pRVar2;
        local_40 = pRVar3;
        ppEVar4 = Properties::getImmediateFallthroughPtr
                            ((Expression **)&local_40,&this->options,module,AllowTeeBrIf);
        pRVar2 = (RefCast *)*ppEVar4;
      } while ((RefCast *)*ppEVar4 != pRVar3);
      if (pRVar3 != (RefCast *)pRVar6->target) {
        pRVar1 = pRVar6->bestCast;
        ppRVar5 = std::__detail::
                  _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::RefCast_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::RefCast_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::RefCast_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::RefCast_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_38->refCastToApply,&pRVar6->target);
        *ppRVar5 = pRVar1;
      }
      pRVar6->bestCast = (RefCast *)0x0;
    }
    pRVar6->target = (key_type)0x0;
  }
  return;
}

Assistant:

void flushRefCastResult(size_t index, Module& module) {
    auto& target = currRefCastMove[index].target;
    if (target) {
      auto& bestCast = currRefCastMove[index].bestCast;
      if (bestCast) {
        // If the fallthrough is equal to the target, this means the cast is
        // already at the target local.get and doesn't need to be duplicated
        // again.
        auto* fallthrough =
          Properties::getFallthrough(bestCast, options, module);
        if (fallthrough != target) {
          refCastToApply[target] = bestCast;
        }
        bestCast = nullptr;
      }
      target = nullptr;
    }
  }